

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O1

void __thiscall
cfd::core::TaprootScriptTree::TaprootScriptTree(TaprootScriptTree *this,TapBranch *leaf_branch)

{
  byte bVar1;
  long lVar2;
  CfdException *pCVar3;
  long lVar4;
  undefined1 local_78 [16];
  char *local_68;
  pointer local_40;
  pointer local_38;
  pointer local_30;
  
  TapBranch::TapBranch(&this->super_TapBranch,leaf_branch);
  (this->super_TapBranch)._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_007fc8a8;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (leaf_branch->has_leaf_ == false) {
    local_78._0_8_ = "cfdcore_taproot.cpp";
    local_78._8_4_ = 0x224;
    local_68 = "TaprootScriptTree";
    logger::log<>((CfdSourceLocation *)local_78,kCfdLogLevelWarning,"object is not tapleaf.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_78._0_8_ = &stack0xffffffffffffff98;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"object is not tapleaf.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_78);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar1 = leaf_branch->leaf_version_;
  if (bVar1 != 0x66) {
    lVar2 = 0;
    do {
      lVar4 = lVar2;
      if (lVar4 == 0x20) goto LAB_004aaa2f;
      lVar2 = lVar4 + 4;
    } while (*(uint *)((long)TaprootUtil::IsValidLeafVersion::kValidLeafVersions + lVar4 + 4) !=
             (uint)bVar1);
    if (lVar4 == 0x20) {
LAB_004aaa2f:
      if (((bVar1 & 1) != 0) || (0x3e < (byte)(bVar1 + 0x40))) {
        local_78._0_8_ = "cfdcore_taproot.cpp";
        local_78._8_4_ = 0x22a;
        local_68 = "TaprootScriptTree";
        local_40 = (pointer)CONCAT71(local_40._1_7_,bVar1);
        logger::log<unsigned_char&>
                  ((CfdSourceLocation *)local_78,kCfdLogLevelWarning,
                   "Unsupported leaf version. [{}]",(uchar *)&stack0xffffffffffffffc0);
        pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
        local_78._0_8_ = &stack0xffffffffffffff98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_78,"Unsupported leaf version.","");
        CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_78);
        __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
  }
  (this->super_TapBranch).has_leaf_ = true;
  (this->super_TapBranch).leaf_version_ = bVar1;
  Script::Script((Script *)local_78,&leaf_branch->script_);
  Script::operator=(&(this->super_TapBranch).script_,(Script *)local_78);
  Script::~Script((Script *)local_78);
  ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::vector
            ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
             &stack0xffffffffffffffc0,&leaf_branch->branch_list_);
  local_78._0_8_ =
       (this->super_TapBranch).branch_list_.
       super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_78._8_8_ =
       (this->super_TapBranch).branch_list_.
       super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_68 = (char *)(this->super_TapBranch).branch_list_.
                     super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->super_TapBranch).branch_list_.
  super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
  super__Vector_impl_data._M_start = local_40;
  (this->super_TapBranch).branch_list_.
  super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
  super__Vector_impl_data._M_finish = local_38;
  (this->super_TapBranch).branch_list_.
  super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_30;
  local_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
            ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)local_78);
  ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
            ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
             &stack0xffffffffffffffc0);
  (*leaf_branch->_vptr_TapBranch[4])(&stack0xffffffffffffffc0,leaf_branch);
  local_78._0_8_ =
       (this->nodes_).
       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_78._8_8_ =
       (this->nodes_).
       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_68 = (char *)(this->nodes_).
                     super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_40;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_38;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_30;
  local_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_78);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &stack0xffffffffffffffc0);
  (this->super_TapBranch).is_elements_ = leaf_branch->is_elements_;
  return;
}

Assistant:

TaprootScriptTree::TaprootScriptTree(const TapBranch& leaf_branch)
    : TapBranch(leaf_branch) {
  if (!leaf_branch.HasTapLeaf()) {
    warn(CFD_LOG_SOURCE, "object is not tapleaf.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "object is not tapleaf.");
  }
  if (!TaprootUtil::IsValidLeafVersion(leaf_branch.GetLeafVersion())) {
    warn(
        CFD_LOG_SOURCE, "Unsupported leaf version. [{}]",
        leaf_branch.GetLeafVersion());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unsupported leaf version.");
  }
  has_leaf_ = true;
  leaf_version_ = leaf_branch.GetLeafVersion();
  script_ = leaf_branch.GetScript();
  branch_list_ = leaf_branch.GetBranchList();
  nodes_ = leaf_branch.GetNodeList();
  is_elements_ = leaf_branch.IsElements();
}